

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_register_device_collection_changed
              (cubeb *context,cubeb_device_type devtype,
              cubeb_device_collection_changed_callback callback,void *user_ptr)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  long *in_RDI;
  undefined4 local_4;
  
  if ((in_RDI == (long *)0x0) || ((in_ESI & 3) == 0)) {
    local_4 = -3;
  }
  else if (*(long *)(*in_RDI + 0xa0) == 0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0xa0))(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

int
cubeb_register_device_collection_changed(
    cubeb * context, cubeb_device_type devtype,
    cubeb_device_collection_changed_callback callback, void * user_ptr)
{
  if (context == NULL ||
      (devtype & (CUBEB_DEVICE_TYPE_INPUT | CUBEB_DEVICE_TYPE_OUTPUT)) == 0)
    return CUBEB_ERROR_INVALID_PARAMETER;

  if (!context->ops->register_device_collection_changed) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  return context->ops->register_device_collection_changed(context, devtype,
                                                          callback, user_ptr);
}